

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O1

int32 __thiscall TTD::MarkTable::FindIndexForKey(MarkTable *this,uint64 addr)

{
  uint64 *puVar1;
  uint64 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  puVar1 = this->m_addrArray;
  if (puVar1 == (uint64 *)0x0) {
    TTDAbort_unrecoverable_error("Not valid!!");
  }
  uVar7 = this->m_capcity - 1;
  uVar5 = (uint)addr & uVar7;
  if (puVar1[uVar5] != 0 && puVar1[uVar5] != addr) {
    uVar5 = uVar5 + (int)(addr % (ulong)this->m_h2Prime);
    uVar4 = uVar5 & uVar7;
    uVar6 = uVar4;
    do {
      uVar2 = puVar1[uVar6];
      uVar3 = uVar6;
      if ((uVar2 != 0 && uVar2 != addr) &&
         (uVar6 = uVar6 + 1 & uVar7, uVar3 = uVar5, uVar6 == uVar4)) {
        TTDAbort_unrecoverable_error("We messed up.");
      }
      uVar5 = uVar3;
    } while (uVar2 != 0 && uVar2 != addr);
  }
  return uVar5;
}

Assistant:

int32 FindIndexForKey(uint64 addr) const
        {
            TTDAssert(this->m_addrArray != nullptr, "Not valid!!");

            uint32 primaryMask = this->m_capcity - 1;

            uint32 primaryIndex = TTD_MARK_TABLE_HASH1(addr, this->m_capcity);
            uint64 primaryAddr = this->m_addrArray[primaryIndex];
            if ((primaryAddr == addr) | (primaryAddr == 0))
            {
                return (int32)primaryIndex;
            }

            //do a hash for the second offset to avoid clustering and then do linear probing
            uint32 offset = TTD_MARK_TABLE_HASH2(addr, this->m_h2Prime);
            uint32 probeIndex = TTD_MARK_TABLE_INDEX(primaryIndex + offset, this->m_capcity);
            while (true)
            {
                uint64 currAddr = this->m_addrArray[probeIndex];
                if ((currAddr == addr) | (currAddr == 0))
                {
                    return (int32)probeIndex;
                }
                probeIndex = TTD_MARK_TABLE_INDEX(probeIndex + 1, this->m_capcity);

                TTDAssert(probeIndex != ((primaryIndex + offset) & primaryMask), "We messed up.");
            }
        }